

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t helper_sel_flags_arm(uint32_t flags,uint32_t a,uint32_t b)

{
  undefined4 local_18;
  uint32_t mask;
  uint32_t b_local;
  uint32_t a_local;
  uint32_t flags_local;
  
  local_18 = 0;
  if ((flags & 1) != 0) {
    local_18 = 0xff;
  }
  if ((flags & 2) != 0) {
    local_18 = local_18 | 0xff00;
  }
  if ((flags & 4) != 0) {
    local_18 = local_18 | 0xff0000;
  }
  if ((flags & 8) != 0) {
    local_18 = local_18 | 0xff000000;
  }
  return a & local_18 | b & (local_18 ^ 0xffffffff);
}

Assistant:

uint32_t HELPER(sel_flags)(uint32_t flags, uint32_t a, uint32_t b)
{
    uint32_t mask;

    mask = 0;
    if (flags & 1)
        mask |= 0xff;
    if (flags & 2)
        mask |= 0xff00;
    if (flags & 4)
        mask |= 0xff0000;
    if (flags & 8)
        mask |= 0xff000000;
    return (a & mask) | (b & ~mask);
}